

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_ManSetInitRefs(Gia_Man_t *p,Vec_Flt_t *vRefs)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  float in_XMM0_Da;
  float fVar5;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  Vec_FltFill(vRefs,p->nObjs,in_XMM0_Da);
  for (iVar4 = 0; iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManObj(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(undefined8 *)pGVar3;
    if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
      Vec_FltAddToEntry(vRefs,iVar4 - (uVar1 & 0x1fffffff),1.0);
      Vec_FltAddToEntry(vRefs,iVar4 - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff),1.0);
      iVar2 = Gia_ObjIsMuxType(pGVar3);
      if (iVar2 != 0) {
        pGVar3 = Gia_ObjRecognizeMux(pGVar3,&local_40,&local_38);
        iVar2 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe));
        Vec_FltAddToEntry(vRefs,iVar2,-1.0);
        if ((Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe) ==
            (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
          iVar2 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe));
          Vec_FltAddToEntry(vRefs,iVar2,-1.0);
        }
      }
    }
  }
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCo(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar3);
    Vec_FltAddToEntry(vRefs,iVar2 - (*(uint *)pGVar3 & 0x1fffffff),1.0);
  }
  for (iVar4 = 0; iVar4 < p->nObjs; iVar4 = iVar4 + 1) {
    fVar5 = Vec_FltEntry(vRefs,iVar4);
    if (fVar5 < 1.0) {
      Vec_FltWriteEntry(vRefs,iVar4,1.0);
    }
  }
  return;
}

Assistant:

void Kf_ManSetInitRefs( Gia_Man_t * p, Vec_Flt_t * vRefs )
{
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; int i;
    Vec_FltFill( vRefs, Gia_ManObjNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId0(pObj, i), 1 );
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId1(pObj, i), 1 );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Vec_FltAddToEntry( vRefs, Gia_ObjId(p, Gia_Regular(pCtrl)), -1 );
        if ( Gia_Regular(pData0) == Gia_Regular(pData1) )
            Vec_FltAddToEntry( vRefs, Gia_ObjId(p, Gia_Regular(pData0)), -1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId0(pObj, Gia_ObjId(p, pObj)), 1 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}